

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentQLearner.cpp
# Opt level: O2

Index __thiscall AgentQLearner::getGreedyAction(AgentQLearner *this,Index sI)

{
  Index IVar1;
  int iVar2;
  _List_node_base *actions_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  list<unsigned_int,_std::allocator<unsigned_int>_> actions;
  _List_base<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  auVar4 = in_ZMM1._8_16_;
  actions_00 = (_List_node_base *)&local_20;
  local_20._M_impl._M_node._M_size = 0;
  local_20._M_impl._M_node.super__List_node_base._M_next = actions_00;
  local_20._M_impl._M_node.super__List_node_base._M_prev = actions_00;
  getMaxState(this,sI,(list<unsigned_int,_std::allocator<unsigned_int>_> *)actions_00);
  iVar2 = rand();
  auVar4 = vcvtusi2sd_avx512f(auVar4,local_20._M_impl._M_node._M_size);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (double)iVar2 * 4.656612873077393e-10 * auVar4._0_8_;
  iVar2 = vcvttsd2usi_avx512f(auVar3);
  iVar2 = iVar2 + 1;
  do {
    actions_00 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&actions_00->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  IVar1 = *(Index *)&actions_00[1]._M_next;
  std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear(&local_20);
  return IVar1;
}

Assistant:

Index AgentQLearner::getGreedyAction(Index sI) const
{
    list<Index> actions;
    double d = getMaxState(sI, &actions);

    // count number of other q-values that are equal to the highest value
    // normally count = 1 so iNr will be zero and the highest one is picked
    unsigned iNr = (unsigned)(rand()/(RAND_MAX+1.0)*actions.size());

    list<Index>::const_iterator iter = actions.begin();
    for(unsigned i = 0; i < iNr; i++)
        iter++;

#if DEBUG_AgentQLearner
    cout << "choose greedy action " << *iter << " in state " << sI
         << " with value " << d << endl;
#endif

    return *iter;
}